

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_CDict *ptr;
  ZSTD_CDict *pZVar1;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  
  if (cdict != (ZSTD_CDict *)0x0) {
    customMem = cdict->customMem;
    ptr = (ZSTD_CDict *)(cdict->workspace).workspace;
    if (cdict < ptr) {
      (cdict->workspace).allocFailed = '\0';
      *(undefined3 *)&(cdict->workspace).field_0x31 = 0;
      (cdict->workspace).workspaceOversizedDuration = 0;
      (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
      (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (cdict->workspace).tableValidEnd = (void *)0x0;
      (cdict->workspace).allocStart = (void *)0x0;
      (cdict->workspace).objectEnd = (void *)0x0;
      (cdict->workspace).tableEnd = (void *)0x0;
      (cdict->workspace).workspace = (void *)0x0;
      (cdict->workspace).workspaceEnd = (void *)0x0;
      ZSTD_customFree(ptr,cdict->customMem);
    }
    else {
      pZVar1 = (ZSTD_CDict *)(cdict->workspace).workspaceEnd;
      (cdict->workspace).allocFailed = '\0';
      *(undefined3 *)&(cdict->workspace).field_0x31 = 0;
      (cdict->workspace).workspaceOversizedDuration = 0;
      (cdict->workspace).phase = ZSTD_cwksp_alloc_objects;
      (cdict->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (cdict->workspace).tableValidEnd = (void *)0x0;
      (cdict->workspace).allocStart = (void *)0x0;
      (cdict->workspace).objectEnd = (void *)0x0;
      (cdict->workspace).tableEnd = (void *)0x0;
      (cdict->workspace).workspace = (void *)0x0;
      (cdict->workspace).workspaceEnd = (void *)0x0;
      ZSTD_customFree(ptr,cdict->customMem);
      if (cdict <= pZVar1) {
        return 0;
      }
    }
    ZSTD_customFree(cdict,customMem);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        int cdictInWorkspace = ZSTD_cwksp_owns_buffer(&cdict->workspace, cdict);
        ZSTD_cwksp_free(&cdict->workspace, cMem);
        if (!cdictInWorkspace) {
            ZSTD_customFree(cdict, cMem);
        }
        return 0;
    }
}